

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

double __thiscall spdlog::logger::log(logger *this,double __x)

{
  __int_type_conflict _Var1;
  int iVar2;
  double dVar3;
  pointer pcVar4;
  size_type sVar5;
  char *pcVar6;
  size_t *psVar7;
  int in_ESI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  log_msg local_90;
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if ((in_ESI < iVar2 & (_Var1 ^ 1U)) == 0) {
    pcVar4 = (this->name_)._M_dataplus._M_p;
    sVar5 = (this->name_)._M_string_length;
    local_90.time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_a8 = SUB84(pcVar4,0);
    uStack_a4 = (undefined4)((ulong)pcVar4 >> 0x20);
    uStack_a0 = (undefined4)sVar5;
    uStack_9c = (undefined4)(sVar5 >> 0x20);
    local_90.logger_name.data_._0_4_ = local_a8;
    local_90.logger_name.data_._4_4_ = uStack_a4;
    local_90.logger_name.size_._0_4_ = uStack_a0;
    local_90.logger_name.size_._4_4_ = uStack_9c;
    pcVar6 = (char *)__tls_get_addr(&PTR_00167d60);
    uVar8 = extraout_XMM0_Da;
    if (*pcVar6 == '\0') {
      dVar3 = log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      uVar8 = SUB84(dVar3,0);
    }
    psVar7 = (size_t *)__tls_get_addr(uVar8,&PTR_00167e28);
    local_90.thread_id = *psVar7;
    local_90.color_range_start = 0;
    local_90.color_range_end = 0;
    if (iVar2 <= in_ESI) {
      (*this->_vptr_logger[3])(this,&local_90);
      in_stack_00000008 = extraout_XMM0_Da_00;
      in_stack_0000000c = extraout_XMM0_Db_00;
    }
    __x = (double)CONCAT44(in_stack_0000000c,in_stack_00000008);
    if ((_Var1 & 1U) != 0) {
      details::backtracer::push_back(&this->tracer_,&local_90);
      __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    }
  }
  return __x;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t msg)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }

        details::log_msg log_msg(loc, name_, lvl, msg);
        log_it_(log_msg, log_enabled, traceback_enabled);
    }